

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_io.c
# Opt level: O1

size_t uo_io_write(int wfd,void *buf,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  sVar1 = write(wfd,buf,len);
  sVar2 = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    sVar2 = 0;
  }
  *(uint *)(in_FS_OFFSET + -0x50) = (uint)(sVar1 == 0xffffffffffffffff);
  return sVar2;
}

Assistant:

size_t uo_io_write(
    int wfd,
    const void *buf,
    size_t len)
{
    #ifdef _WIN32

        DWORD wlen;
        OVERLAPPED overlapped = { 0 };

        if (!WriteFile((HANDLE)(uintptr_t)wfd, buf, len, &wlen, &overlapped))
        {
            // TODO: specify what error occurred
            uo_io_errno = UO_IO_ERR_UNKNOWN;
            return 0;
        }

    #else

        ssize_t wlen = write(wfd, buf, len);
        
        if (wlen == -1)
        {
            // TODO: specify what error occurred
            uo_io_errno = UO_IO_ERR_UNKNOWN;
            return 0;
        }

    #endif

        uo_io_errno = UO_IO_ERR_NONE;

        return wlen;
}